

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

ssize_t __thiscall
anon_unknown.dwarf_308a495::Pipe::read(Pipe *this,int __fd,void *__buf,size_t __nbytes)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  undefined4 in_register_00000034;
  void *pvVar3;
  void *pvVar4;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &this->mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  pvVar3 = (void *)0x0;
  do {
    if (this->closed == false) {
      do {
        ppuVar1 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
        if ((this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_start._M_last +
            (long)((this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur +
                  (((((ulong)((long)ppuVar1 -
                             (long)(this->data).
                                   super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                  (long)(this->data).
                        super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first)) !=
            (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur) break;
        std::condition_variable::wait((unique_lock *)&this->cv);
      } while (this->closed != true);
    }
    pvVar4 = pvVar3;
    if (this->closed != false) break;
    if (pvVar3 < __buf) {
      do {
        ppuVar1 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
        puVar2 = (this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
        pvVar4 = pvVar3;
        if ((this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_start._M_last +
            (long)((this->data).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur +
                  (((((ulong)((long)ppuVar1 -
                             (long)(this->data).
                                   super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                  (long)(this->data).
                        super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first)) == puVar2) break;
        *(uchar *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar3) = *puVar2;
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this->data);
        pvVar3 = (void *)((long)pvVar3 + 1);
        pvVar4 = __buf;
      } while (__buf != pvVar3);
    }
    pvVar3 = pvVar4;
  } while (pvVar4 != __buf);
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return (ssize_t)pvVar4;
}

Assistant:

size_t read(void* buffer, size_t bytes) override {
    std::unique_lock<std::mutex> lock(mutex);
    auto out = reinterpret_cast<uint8_t*>(buffer);
    size_t n = 0;
    while (true) {
      cv.wait(lock, [&] { return closed || data.size() > 0; });
      if (closed) {
        return n;
      }
      for (; n < bytes && data.size() > 0; n++) {
        out[n] = data.front();
        data.pop_front();
      }
      if (n == bytes) {
        return n;
      }
    }
  }